

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cc
# Opt level: O0

PortPackedStruct * __thiscall
kratos::Generator::port_packed
          (Generator *this,PortDirection direction,string *port_name,
          shared_ptr<kratos::PackedStruct> *packed_struct_,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *size)

{
  element_type *peVar1;
  shared_ptr<kratos::PortPackedStruct> sVar2;
  Generator *local_48;
  undefined1 local_40 [8];
  shared_ptr<kratos::PortPackedStruct> p;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *size_local;
  shared_ptr<kratos::PackedStruct> *packed_struct__local;
  string *port_name_local;
  Generator *pGStack_10;
  PortDirection direction_local;
  Generator *this_local;
  
  local_48 = this;
  p.super___shared_ptr<kratos::PortPackedStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)size;
  port_name_local._4_4_ = direction;
  pGStack_10 = this;
  sVar2 = std::
          make_shared<kratos::PortPackedStruct,kratos::Generator*,kratos::PortDirection&,std::__cxx11::string_const&,std::shared_ptr<kratos::PackedStruct>const&,std::vector<unsigned_int,std::allocator<unsigned_int>>const&>
                    ((Generator **)local_40,(PortDirection *)&local_48,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&port_name_local + 4),(shared_ptr<kratos::PackedStruct> *)port_name,
                     (vector<unsigned_int,_std::allocator<unsigned_int>_> *)packed_struct_);
  (*(this->super_IRNode)._vptr_IRNode[7])
            (this,port_name,
             sVar2.super___shared_ptr<kratos::PortPackedStruct,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi._M_pi);
  std::
  map<std::__cxx11::string,std::shared_ptr<kratos::Var>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>>>
  ::emplace<std::__cxx11::string_const&,std::shared_ptr<kratos::PortPackedStruct>&>
            ((map<std::__cxx11::string,std::shared_ptr<kratos::Var>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>>>
              *)&this->vars_,port_name,(shared_ptr<kratos::PortPackedStruct> *)local_40);
  peVar1 = std::
           __shared_ptr_access<kratos::PortPackedStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator*((__shared_ptr_access<kratos::PortPackedStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)local_40);
  std::shared_ptr<kratos::PortPackedStruct>::~shared_ptr
            ((shared_ptr<kratos::PortPackedStruct> *)local_40);
  return peVar1;
}

Assistant:

PortPackedStruct &Generator::port_packed(PortDirection direction, const std::string &port_name,
                                         const std::shared_ptr<PackedStruct> &packed_struct_,
                                         const std::vector<uint32_t> &size) {
    auto p = std::make_shared<PortPackedStruct>(this, direction, port_name, packed_struct_, size);
    add_port_name(port_name);
    vars_.emplace(port_name, p);
    return *p;
}